

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_assq_op(sexp ctx,sexp self,sexp_sint_t n,sexp x,sexp ls)

{
  bool bVar1;
  sexp ls_local;
  sexp x_local;
  sexp_sint_t n_local;
  sexp self_local;
  sexp ctx_local;
  
  ls_local = ls;
  while( true ) {
    bVar1 = false;
    if (((ulong)ls_local & 3) == 0) {
      bVar1 = ls_local->tag == 6;
    }
    if (!bVar1) break;
    if (((((ls_local->value).stack.length & 3) == 0) && (((ls_local->value).type.name)->tag == 6))
       && (x == (((ls_local->value).type.name)->value).type.name)) {
      return (sexp)(ls_local->value).flonum;
    }
    ls_local = (ls_local->value).type.cpl;
  }
  return (sexp)&DAT_0000003e;
}

Assistant:

sexp sexp_assq_op (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp ls) {
  while (sexp_pairp(ls))
    if (sexp_pairp(sexp_car(ls)) && (x == sexp_caar(ls)))
      return sexp_car(ls);
    else
      ls = sexp_cdr(ls);
  return SEXP_FALSE;
}